

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O3

FunctionResult * __thiscall
wasm::ExecutionResults::run
          (FunctionResult *__return_storage_ptr__,ExecutionResults *this,Function *func,Module *wasm
          ,ModuleRunner *instance)

{
  pointer pNVar1;
  string_view name;
  size_t sVar2;
  char cVar3;
  Type *pTVar4;
  Type local_c8;
  undefined1 local_c0 [32];
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_a0;
  undefined1 auStack_88 [8];
  Literals arguments;
  undefined1 local_48 [8];
  Iterator __begin2;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)__return_storage_ptr__;
  local_c8.id = ::wasm::HeapType::getSignature();
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  local_48 = (undefined1  [8])&local_c8;
  pTVar4 = (Type *)::wasm::Type::size();
  if (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent == pTVar4)
  goto LAB_0017f0bb;
  do {
    do {
      ::wasm::Type::Iterator::operator*((Iterator *)local_48);
      cVar3 = ::wasm::Type::isDefaultable();
      if (cVar3 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "[trap fuzzer can only send defaultable parameters to exports]\n",0x3e);
        *(undefined1 *)
         (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 0x38)
             = 1;
        goto LAB_0017f1cf;
      }
      ::wasm::Literal::makeZero((Type)local_c0);
      SmallVector<wasm::Literal,_1UL>::push_back
                ((SmallVector<wasm::Literal,_1UL> *)auStack_88,(Literal *)local_c0);
      ::wasm::Literal::~Literal((Literal *)local_c0);
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
             pTVar4);
LAB_0017f0bb:
  } while (local_48 != (undefined1  [8])&local_c8);
  name = (func->super_Importable).super_Named.name.super_IString.str;
  (instance->super_ModuleRunnerBase<wasm::ModuleRunner>).callDepth = 0;
  pNVar1 = (instance->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack.
           super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((instance->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack.
      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
      _M_finish != pNVar1) {
    (instance->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack.
    super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
    _M_finish = pNVar1;
  }
  ModuleRunnerBase<wasm::ModuleRunner>::callFunctionInternal
            ((Literals *)local_c0,&instance->super_ModuleRunnerBase<wasm::ModuleRunner>,(Name)name,
             (Literals *)auStack_88);
  sVar2 = __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  *(undefined8 *)__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
       = local_c0._0_8_;
  ::wasm::Literal::Literal
            ((Literal *)
             (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 8
             ),(Literal *)(local_c0 + 8));
  *(pointer *)(sVar2 + 0x20) =
       local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(sVar2 + 0x28) =
       local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(sVar2 + 0x30) =
       local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)(sVar2 + 0x38) = 0;
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_a0);
  ::wasm::Literal::~Literal((Literal *)(local_c0 + 8));
LAB_0017f1cf:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  ::wasm::Literal::~Literal((Literal *)&arguments);
  return (FunctionResult *)
         __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
}

Assistant:

FunctionResult run(Function* func, Module& wasm, ModuleRunner& instance) {
    try {
      // call the method
      Literals arguments;
      for (const auto& param : func->getParams()) {
        // zeros in arguments TODO: more?
        if (!param.isDefaultable()) {
          std::cout << "[trap fuzzer can only send defaultable parameters to "
                       "exports]\n";
          return Trap{};
        }
        arguments.push_back(Literal::makeZero(param));
      }
      return instance.callFunction(func->name, arguments);
    } catch (const TrapException&) {
      return Trap{};
    } catch (const WasmException& e) {
      std::cout << "[exception thrown: " << e << "]" << std::endl;
      return Exception{};
    } catch (const HostLimitException&) {
      // This should be ignored and not compared with, as optimizations can
      // change whether a host limit is reached.
      ignore = true;
      return {};
    }
  }